

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQRESULT SVar3;
  SQObjectPtr *o;
  SQObjectPtr local_20;
  SQObjectPtr *local_10;
  
  local_10 = (SQObjectPtr *)0x0;
  bVar2 = sq_aux_gettypedarg(v,idx,OT_CLASS,&local_10);
  SVar3 = -1;
  if (bVar2) {
    if (((local_10->super_SQObject)._unVal.pTable)->_firstfree == (_HashNode *)0x0) {
      SQVM::PushNull(v);
    }
    else {
      local_20.super_SQObject._unVal =
           (SQObjectValue)((local_10->super_SQObject)._unVal.pClosure)->_root;
      local_20.super_SQObject._type = OT_CLASS;
      if (local_20.super_SQObject._unVal.pTable == (SQTable *)0x0) {
        __assert_fail("_unVal.pTable",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                      ,0xe3,"SQObjectPtr::SQObjectPtr(SQClass *)");
      }
      pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Push(v,&local_20);
      SQObjectPtr::~SQObjectPtr(&local_20);
    }
    SVar3 = 0;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    if(_class(*o)->_base)
        v->Push(SQObjectPtr(_class(*o)->_base));
    else
        v->PushNull();
    return SQ_OK;
}